

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::
Maybe<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
::Maybe(Maybe<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
        *this,Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>
              *t)

{
  Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>
  *t_00;
  Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>
  *t_local;
  Maybe<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
  *this_local;
  
  t_00 = mv<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>>
                   (t);
  kj::_::
  NullableValue<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
  ::NullableValue(&this->ptr,t_00);
  return;
}

Assistant:

Maybe(T&& t): ptr(kj::mv(t)) {}